

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::pragma_newline_spacing(CTcTokenizer *this)

{
  utf8_ptr *p;
  CTcToken *tok;
  int *piVar1;
  short *psVar2;
  long *plVar3;
  tc_toktyp_t tVar4;
  newline_spacing_mode_t nVar5;
  
  if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x4) !=
      (undefined1  [3440])0x0) {
    return;
  }
  p = &this->p_;
  tok = &this->curtok_;
  tVar4 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
  if ((tVar4 == TOKT_LPAR) &&
     (tVar4 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0), tVar4 == TOKT_SYM)) {
    switch((this->curtok_).text_len_) {
    case 2:
      if (*(short *)(this->curtok_).text_ == 0x6e6f) {
LAB_0022003b:
        nVar5 = NEWLINE_SPACING_COLLAPSE;
        goto LAB_00220040;
      }
      break;
    case 3:
      psVar2 = (short *)(this->curtok_).text_;
      if ((char)psVar2[1] == 'f' && *psVar2 == 0x666f) {
LAB_0022000b:
        nVar5 = NEWLINE_SPACING_DELETE;
        goto LAB_00220040;
      }
      break;
    case 6:
      piVar1 = (int *)(this->curtok_).text_;
      if ((short)piVar1[1] == 0x6574 && *piVar1 == 0x656c6564) goto LAB_0022000b;
      break;
    case 8:
      plVar3 = (long *)(this->curtok_).text_;
      if (*plVar3 == 0x657370616c6c6f63) goto LAB_0022003b;
      if (*plVar3 != 0x6576726573657270) break;
      nVar5 = NEWLINE_SPACING_PRESERVE;
LAB_00220040:
      tVar4 = next_on_line(p,tok,(tok_embed_ctx *)0x0,0);
      if (tVar4 == TOKT_RPAR) {
        this->string_newline_spacing_ = nVar5;
        goto LAB_00220065;
      }
    }
  }
  log_warning(0x271f);
LAB_00220065:
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
}

Assistant:

void CTcTokenizer::pragma_newline_spacing()
{
    newline_spacing_mode_t f;

    /* if we're in preprocess-only mode, just pass the pragma through */
    if (pp_only_mode_)
        return;
    
    /* get the '(' token and the on/off token */
    if (next_on_line() != TOKT_LPAR || next_on_line() != TOKT_SYM)
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* note the new mode flag */
    if (curtok_.get_text_len() == 2
        && memcmp(curtok_.get_text(), "on", 2) == 0)
    {
        /* 'on' - this is the old version of 'collapse' */
        f = NEWLINE_SPACING_COLLAPSE;
    }
    else if (curtok_.get_text_len() == 8
             && memcmp(curtok_.get_text(), "collapse", 8) == 0)
    {
        f = NEWLINE_SPACING_COLLAPSE;
    }
    else if (curtok_.get_text_len() == 3
             && memcmp(curtok_.get_text(), "off", 3) == 0)
    {
        /* 'off' - the old version of 'delete' */
        f = NEWLINE_SPACING_DELETE;
    }
    else if (curtok_.get_text_len() == 6
             && memcmp(curtok_.get_text(), "delete", 6) == 0)
    {
        f = NEWLINE_SPACING_DELETE;
    }
    else if (curtok_.get_text_len() == 8
             && memcmp(curtok_.get_text(), "preserve", 8) == 0)
    {
        f = NEWLINE_SPACING_PRESERVE;
    }
    else
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* make sure we have the ')' token */
    if (next_on_line() != TOKT_RPAR)
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* set the new mode */
    string_newline_spacing_ = f;

done:
    /* done - discard this line buffer */
    clear_linebuf();
}